

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

bool rcg::anon_unknown_6::getStreamBool
               (shared_ptr<const_rcg::GenTLWrapper> *gentl,void *stream,STREAM_INFO_CMD cmd)

{
  element_type *peVar1;
  STREAM_INFO_CMD in_EDX;
  DS_HANDLE in_RSI;
  size_t size;
  INFO_DATATYPE type;
  bool8_t ret;
  size_t local_28;
  INFO_DATATYPE local_1c;
  byte local_15;
  STREAM_INFO_CMD local_14;
  DS_HANDLE local_10;
  
  local_15 = 0;
  local_28 = 1;
  if (in_RSI != (DS_HANDLE)0x0) {
    local_14 = in_EDX;
    local_10 = in_RSI;
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x121ec1);
    (*peVar1->DSGetInfo)(local_10,local_14,&local_1c,&local_15,&local_28);
  }
  return (local_15 & 1) != 0;
}

Assistant:

inline bool getStreamBool(const std::shared_ptr<const GenTLWrapper> &gentl,
                          void *stream, GenTL::STREAM_INFO_CMD cmd)
{
  bool8_t ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(ret);

  if (stream != 0)
  {
    gentl->DSGetInfo(stream, cmd, &type, &ret, &size);
  }

  return ret != 0;
}